

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SEQUENCE_OF.c
# Opt level: O1

asn_enc_rval_t *
SEQUENCE_OF_encode_uper
          (asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,
          asn_per_constraints_t *constraints,void *sptr,asn_per_outp_t *po)

{
  asn_TYPE_member_s *paVar1;
  void *pvVar2;
  asn_TYPE_descriptor_s *paVar3;
  bool bVar4;
  int iVar5;
  ssize_t sVar6;
  asn_per_constraint_s *paVar7;
  int iVar8;
  ulong uVar9;
  ssize_t sVar10;
  bool bVar11;
  asn_TYPE_descriptor_t *local_80;
  void *local_78;
  ssize_t local_70;
  ulong local_60;
  asn_enc_rval_t local_48;
  
  if (sptr == (void *)0x0) {
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = (void *)0x0;
    return __return_storage_ptr__;
  }
  if (constraints == (asn_per_constraints_t *)0x0) {
    paVar7 = &td->per_constraints->size;
    if (td->per_constraints == (asn_per_constraints_t *)0x0) {
      paVar7 = (asn_per_constraint_s *)0x0;
    }
  }
  else {
    paVar7 = &constraints->size;
  }
  paVar1 = td->elements;
  if (paVar7 == (asn_per_constraint_s *)0x0) {
    paVar7 = (asn_per_constraint_s *)0x0;
    goto LAB_00145df6;
  }
  bVar11 = true;
  if (paVar7->lower_bound <= (long)*(int *)((long)sptr + 8)) {
    bVar11 = paVar7->upper_bound < (long)*(int *)((long)sptr + 8);
  }
  if ((paVar7->flags & APC_EXTENSIBLE) == APC_UNCONSTRAINED) {
    bVar4 = true;
    if ((bVar11 != false) && (-1 < paVar7->effective_bits)) {
LAB_00145dcd:
      __return_storage_ptr__->encoded = -1;
      __return_storage_ptr__->failed_type = td;
      __return_storage_ptr__->structure_ptr = sptr;
      bVar4 = false;
    }
  }
  else {
    iVar5 = per_put_few_bits(po,(uint)bVar11,1);
    if (iVar5 != 0) goto LAB_00145dcd;
    if (bVar11 != false) {
      paVar7 = (asn_per_constraint_s *)0x0;
    }
    bVar4 = true;
  }
  if (!bVar4) {
    return __return_storage_ptr__;
  }
LAB_00145df6:
  if (((paVar7 == (asn_per_constraint_s *)0x0) || (paVar7->effective_bits < 0)) ||
     (iVar5 = per_put_few_bits(po,*(int *)((long)sptr + 8) - (int)paVar7->lower_bound,
                               paVar7->effective_bits), iVar5 == 0)) {
    local_70 = __return_storage_ptr__->encoded;
    local_80 = __return_storage_ptr__->failed_type;
    local_78 = __return_storage_ptr__->structure_ptr;
    local_60 = 0xffffffff;
    sVar10 = 0;
    do {
      iVar5 = *(int *)((long)sptr + 8);
      sVar6 = (ssize_t)iVar5;
      if (iVar5 <= (int)local_60) {
        __return_storage_ptr__->encoded = sVar10;
        __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
        __return_storage_ptr__->structure_ptr = (void *)0x0;
        return __return_storage_ptr__;
      }
      uVar9 = local_60 & 0xffffffff;
      if ((int)local_60 < 1) {
        uVar9 = 0;
      }
      iVar8 = (int)uVar9;
      if (((paVar7 == (asn_per_constraint_s *)0x0) || (paVar7->effective_bits < 0)) &&
         (sVar6 = uper_put_length(po,(long)(iVar5 - iVar8)), sVar6 < 0)) {
        local_70 = -1;
        bVar11 = false;
        local_80 = td;
        local_78 = sptr;
        local_60 = uVar9;
      }
      else {
        iVar5 = (int)sVar6;
        do {
          bVar11 = sVar6 == 0;
          sVar6 = sVar6 + -1;
          local_60 = (ulong)(uint)(iVar8 + iVar5);
          if (bVar11) break;
          pvVar2 = *(void **)(*sptr + uVar9 * 8);
          if (pvVar2 == (void *)0x0) {
            local_70 = -1;
            bVar4 = false;
            local_80 = td;
            local_78 = sptr;
          }
          else {
            paVar3 = paVar1->type;
            (*paVar3->uper_encoder)(&local_48,paVar3,paVar1->per_constraints,pvVar2,po);
            bVar4 = true;
            sVar10 = local_48.encoded;
            if (local_48.encoded == -1) {
              local_70 = -1;
              bVar4 = false;
              sVar10 = -1;
              local_80 = td;
              local_78 = sptr;
            }
          }
          uVar9 = uVar9 + 1;
          local_60 = uVar9;
        } while (bVar4);
      }
    } while (bVar11);
    __return_storage_ptr__->failed_type = local_80;
    __return_storage_ptr__->structure_ptr = local_78;
    __return_storage_ptr__->encoded = local_70;
  }
  else {
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = sptr;
  }
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
SEQUENCE_OF_encode_uper(asn_TYPE_descriptor_t *td,
	asn_per_constraints_t *constraints, void *sptr, asn_per_outp_t *po) {
	asn_anonymous_sequence_ *list;
	asn_per_constraint_t *ct;
	asn_enc_rval_t er;
	asn_TYPE_member_t *elm = td->elements;
	int seq;

	if(!sptr) ASN__ENCODE_FAILED;
	list = _A_SEQUENCE_FROM_VOID(sptr);

	er.encoded = 0;

	ASN_DEBUG("Encoding %s as SEQUENCE OF (%d)", td->name, list->count);

	if(constraints) ct = &constraints->size;
	else if(td->per_constraints) ct = &td->per_constraints->size;
	else ct = 0;

	/* If extensible constraint, check if size is in root */
	if(ct) {
		int not_in_root = (list->count < ct->lower_bound
				|| list->count > ct->upper_bound);
		ASN_DEBUG("lb %ld ub %ld %s",
			ct->lower_bound, ct->upper_bound,
			ct->flags & APC_EXTENSIBLE ? "ext" : "fix");
		if(ct->flags & APC_EXTENSIBLE) {
			/* Declare whether size is in extension root */
			if(per_put_few_bits(po, not_in_root, 1))
				ASN__ENCODE_FAILED;
			if(not_in_root) ct = 0;
		} else if(not_in_root && ct->effective_bits >= 0)
			ASN__ENCODE_FAILED;
	}

	if(ct && ct->effective_bits >= 0) {
		/* X.691, #19.5: No length determinant */
		if(per_put_few_bits(po, list->count - ct->lower_bound,
				ct->effective_bits))
			ASN__ENCODE_FAILED;
	}

	for(seq = -1; seq < list->count;) {
		ssize_t mayEncode;
		if(seq < 0) seq = 0;
		if(ct && ct->effective_bits >= 0) {
			mayEncode = list->count;
		} else {
			mayEncode = uper_put_length(po, list->count - seq);
			if(mayEncode < 0) ASN__ENCODE_FAILED;
		}

		while(mayEncode--) {
			void *memb_ptr = list->array[seq++];
			if(!memb_ptr) ASN__ENCODE_FAILED;
			er = elm->type->uper_encoder(elm->type,
				elm->per_constraints, memb_ptr, po);
			if(er.encoded == -1)
				ASN__ENCODE_FAILED;
		}
	}

	ASN__ENCODED_OK(er);
}